

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O2

bool __thiscall
Pda::checkForTrans(Pda *this,
                  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *v,
                  Transition *t)

{
  pointer ppTVar1;
  Transition *this_00;
  Node *pNVar2;
  Node *pNVar3;
  pointer ppTVar4;
  
  ppTVar1 = (v->
            super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar4 = (v->
                 super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppTVar4 != ppTVar1;
      ppTVar4 = ppTVar4 + 1) {
    this_00 = *ppTVar4;
    pNVar2 = Tjen::Node::Transition::getTo(t);
    pNVar3 = Tjen::Node::Transition::getTo(this_00);
    if (pNVar2 == pNVar3) {
      pNVar2 = Tjen::Node::Transition::getFrom(t);
      pNVar3 = Tjen::Node::Transition::getFrom(this_00);
      if (pNVar2 == pNVar3) break;
    }
  }
  return ppTVar4 != ppTVar1;
}

Assistant:

bool Pda::checkForTrans(std::vector<Tjen::Node::Transition*> &v, Tjen::Node::Transition *t) {
    for (Tjen::Node::Transition* trans:v) {
        if(t->getTo() == trans->getTo()  && t->getFrom() == trans->getFrom()){ return true;}

    }
    return false;
}